

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

bool __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parse
          (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ostream *output,ostream *error)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  ostream *local_28;
  ostream *error_local;
  ostream *output_local;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_28 = error;
  error_local = output;
  output_local = (ostream *)this;
  Parser::parse(&local_48,(string *)&(this->super_CmdBase).arguments);
  std::__cxx11::string::operator=((string *)&this->value,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return true;
}

Assistant:

virtual bool parse(std::ostream& output, std::ostream& error) {
				try {
					value = Parser::parse(arguments, value);
					return true;
				} catch (...) {
					return false;
				}
			}